

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Expression * __thiscall
soul::BlockBuilder::createComparisonOp(BlockBuilder *this,Expression *lhs,Expression *rhs,Op op)

{
  Expression *pEVar1;
  CodeLocation local_38;
  Op local_24;
  Expression *pEStack_20;
  Op op_local;
  Expression *rhs_local;
  Expression *lhs_local;
  BlockBuilder *this_local;
  
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  local_24 = op;
  pEStack_20 = rhs;
  rhs_local = lhs;
  lhs_local = (Expression *)this;
  CodeLocation::CodeLocation(&local_38);
  pEVar1 = createBinaryOp(this,&local_38,rhs_local,pEStack_20,local_24);
  CodeLocation::~CodeLocation(&local_38);
  return pEVar1;
}

Assistant:

heart::Expression& createComparisonOp (heart::Expression& lhs, heart::Expression& rhs, BinaryOp::Op op)
    {
        return createBinaryOp ({}, lhs, rhs, op);
    }